

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandQuaReach(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  char *pcVar3;
  uint local_44;
  uint local_40;
  int fVerbose;
  int nIters;
  int c;
  Abc_Ntk_t *pNtkRes;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  local_40 = 0x100;
  local_44 = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    while( true ) {
      iVar1 = Extra_UtilGetopt(argc,argv,"Ivh");
      if (iVar1 == -1) {
        if (pAVar2 == (Abc_Ntk_t *)0x0) {
          Abc_Print(-1,"Empty network.\n");
          return 1;
        }
        iVar1 = Abc_NtkGetChoiceNum(pAVar2);
        if (iVar1 != 0) {
          Abc_Print(-1,"This command cannot be applied to an AIG with choice nodes.\n");
          return 1;
        }
        iVar1 = Abc_NtkIsComb(pAVar2);
        if (iVar1 == 0) {
          Abc_Print(-1,"This command works only for combinational transition relations.\n");
          return 1;
        }
        iVar1 = Abc_NtkIsStrash(pAVar2);
        if (iVar1 == 0) {
          Abc_Print(-1,"This command works only for strashed networks.\n");
          return 1;
        }
        iVar1 = Abc_NtkPoNum(pAVar2);
        if (1 < iVar1) {
          Abc_Print(-1,"The transition relation should have one output.\n");
          return 1;
        }
        iVar1 = Abc_NtkPiNum(pAVar2);
        if (iVar1 % 2 != 0) {
          Abc_Print(-1,"The transition relation should have an even number of inputs.\n");
          return 1;
        }
        pAVar2 = Abc_NtkReachability(pAVar2,local_40,local_44);
        if (pAVar2 == (Abc_Ntk_t *)0x0) {
          Abc_Print(-1,"Command has failed.\n");
          return 0;
        }
        Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
        return 0;
      }
      if (iVar1 == 0x49) break;
      if ((iVar1 == 0x68) || (iVar1 != 0x76)) goto LAB_0027b702;
      local_44 = local_44 ^ 1;
    }
    if (argc <= globalUtilOptind) break;
    local_40 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)local_40 < 0) {
LAB_0027b702:
      Abc_Print(-2,"usage: qreach [-I num] [-vh]\n");
      Abc_Print(-2,"\t         computes unreachable states using AIG-based quantification\n");
      Abc_Print(-2,"\t         assumes that the current network is a transition relation\n");
      Abc_Print(-2,"\t         assumes that the initial state is composed of all zeros\n");
      Abc_Print(-2,"\t-I num : the number of image computations to perform [default = %d]\n",
                (ulong)local_40);
      pcVar3 = "no";
      if (local_44 != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar3);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-I\" should be followed by an integer.\n");
  goto LAB_0027b702;
}

Assistant:

int Abc_CommandQuaReach( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c, nIters, fVerbose;
    extern Abc_Ntk_t * Abc_NtkReachability( Abc_Ntk_t * pNtk, int nIters, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    nIters   = 256;
    fVerbose =   0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Ivh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            nIters = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nIters < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkGetChoiceNum( pNtk ) )
    {
        Abc_Print( -1, "This command cannot be applied to an AIG with choice nodes.\n" );
        return 1;
    }
    if ( !Abc_NtkIsComb(pNtk) )
    {
        Abc_Print( -1, "This command works only for combinational transition relations.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command works only for strashed networks.\n" );
        return 1;
    }
    if ( Abc_NtkPoNum(pNtk) > 1 )
    {
        Abc_Print( -1, "The transition relation should have one output.\n" );
        return 1;
    }
    if ( Abc_NtkPiNum(pNtk) % 2 != 0 )
    {
        Abc_Print( -1, "The transition relation should have an even number of inputs.\n" );
        return 1;
    }

    pNtkRes = Abc_NtkReachability( pNtk, nIters, fVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Command has failed.\n" );
        return 0;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: qreach [-I num] [-vh]\n" );
    Abc_Print( -2, "\t         computes unreachable states using AIG-based quantification\n" );
    Abc_Print( -2, "\t         assumes that the current network is a transition relation\n" );
    Abc_Print( -2, "\t         assumes that the initial state is composed of all zeros\n" );
    Abc_Print( -2, "\t-I num : the number of image computations to perform [default = %d]\n", nIters );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}